

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_x509a.cc
# Opt level: O1

uchar * X509_alias_get0(X509 *x,int *len)

{
  int *piVar1;
  int iVar2;
  
  if (x->altname == (stack_st_GENERAL_NAME *)0x0) {
    piVar1 = (int *)0x0;
  }
  else {
    piVar1 = *(int **)&(x->altname->stack).sorted;
  }
  if (len != (int *)0x0) {
    if (piVar1 == (int *)0x0) {
      iVar2 = 0;
    }
    else {
      iVar2 = *piVar1;
    }
    *len = iVar2;
  }
  if (piVar1 != (int *)0x0) {
    return *(uchar **)(piVar1 + 2);
  }
  return (uchar *)0x0;
}

Assistant:

const uint8_t *X509_alias_get0(const X509 *x, int *out_len) {
  const ASN1_UTF8STRING *alias = x->aux != NULL ? x->aux->alias : NULL;
  if (out_len != NULL) {
    *out_len = alias != NULL ? alias->length : 0;
  }
  return alias != NULL ? alias->data : NULL;
}